

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

void Cgt_ManConstructCare(Aig_Man_t *pNew,Aig_Man_t *pCare,Vec_Vec_t *vSuppsInv,Vec_Ptr_t *vLeaves)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_58;
  int iOut;
  int k;
  int i;
  Aig_Obj_t *pObjAig;
  Aig_Obj_t *pPo;
  Aig_Obj_t *pPi;
  Aig_Obj_t *pLeaf;
  Vec_Int_t *vOuts;
  Vec_Ptr_t *vLeaves_local;
  Vec_Vec_t *vSuppsInv_local;
  Aig_Man_t *pCare_local;
  Aig_Man_t *pNew_local;
  
  Aig_ManIncrementTravId(pCare);
  for (iOut = 0; iVar1 = Vec_PtrSize(vLeaves), iOut < iVar1; iOut = iOut + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iOut);
    iVar1 = Aig_ObjCioId(pAVar2);
    pAVar3 = Aig_ManCi(pCare,iVar1);
    Aig_ObjSetTravIdCurrent(pCare,pAVar3);
    pAVar3->field_5 = pAVar2->field_5;
  }
  for (iOut = 0; iVar1 = Vec_PtrSize(vLeaves), iOut < iVar1; iOut = iOut + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iOut);
    iVar1 = Aig_ObjCioId(pAVar2);
    p = Vec_VecEntryInt(vSuppsInv,iVar1);
    for (local_58 = 0; iVar1 = Vec_IntSize(p), local_58 < iVar1; local_58 = local_58 + 1) {
      iVar1 = Vec_IntEntry(p,local_58);
      pAVar2 = Aig_ManCo(pCare,iVar1);
      iVar1 = Aig_ObjIsTravIdCurrent(pCare,pAVar2);
      if (iVar1 == 0) {
        Aig_ObjSetTravIdCurrent(pCare,pAVar2);
        pAVar3 = Aig_ObjFanin0(pAVar2);
        pAVar4 = Aig_ManConst1(pCare);
        if (pAVar3 != pAVar4) {
          pAVar3 = Aig_ObjFanin0(pAVar2);
          pAVar3 = Cgt_ManConstructCare_rec(pCare,pAVar3,pNew);
          if (pAVar3 != (Aig_Obj_t *)0x0) {
            iVar1 = Aig_ObjFaninC0(pAVar2);
            pAVar2 = Aig_NotCond(pAVar3,iVar1);
            Aig_ObjCreateCo(pNew,pAVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Cgt_ManConstructCare( Aig_Man_t * pNew, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, Vec_Ptr_t * vLeaves )
{
    Vec_Int_t * vOuts;
    Aig_Obj_t * pLeaf, * pPi, * pPo, * pObjAig;
    int i, k, iOut;
    // go through the PIs of the partition
    // label the corresponding PIs of the care set
    Aig_ManIncrementTravId( pCare );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, i )
    {
        pPi = Aig_ManCi( pCare, Aig_ObjCioId(pLeaf) );
        Aig_ObjSetTravIdCurrent( pCare, pPi );
        pPi->pData = pLeaf->pData;
    }
    // construct the constraints
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, i )
    {
        vOuts = Vec_VecEntryInt( vSuppsInv, Aig_ObjCioId(pLeaf) );
        Vec_IntForEachEntry( vOuts, iOut, k )
        {
            pPo = Aig_ManCo( pCare, iOut );
            if ( Aig_ObjIsTravIdCurrent( pCare, pPo ) )
                continue;
            Aig_ObjSetTravIdCurrent( pCare, pPo );
            if ( Aig_ObjFanin0(pPo) == Aig_ManConst1(pCare) )
                continue;
            pObjAig = Cgt_ManConstructCare_rec( pCare, Aig_ObjFanin0(pPo), pNew );
            if ( pObjAig == NULL )
                continue;
            pObjAig = Aig_NotCond( pObjAig, Aig_ObjFaninC0(pPo) );
            Aig_ObjCreateCo( pNew, pObjAig );
        }
    }
}